

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

void __thiscall
wallet::CoinsResult::Erase
          (CoinsResult *this,
          unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
          *coins_to_remove)

{
  COutput *pCVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  long lVar4;
  __normal_iterator<wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
  __first;
  __normal_iterator<wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
  _Var5;
  long lVar6;
  long in_FS_OFFSET;
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  *local_58;
  CoinsResult *local_50;
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  *local_48;
  CoinsResult *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var3 = (this->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(this->coins)._M_t._M_impl.super__Rb_tree_header) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    _Var5._M_current = (COutput *)p_Var3[1]._M_parent;
    pCVar1 = (COutput *)p_Var3[1]._M_left;
    lVar4 = (long)pCVar1 - (long)_Var5._M_current;
    local_58 = coins_to_remove;
    local_50 = this;
    local_48 = coins_to_remove;
    local_40 = this;
    for (lVar6 = lVar4 / 0xa0 >> 2; 0 < lVar6; lVar6 = lVar6 + -1) {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
              ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                            *)&local_48,_Var5);
      __first._M_current = _Var5._M_current;
      if (bVar2) goto LAB_0044c96e;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
              ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                            *)&local_48,_Var5._M_current + 1);
      __first._M_current = _Var5._M_current + 1;
      if (bVar2) goto LAB_0044c96e;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
              ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                            *)&local_48,_Var5._M_current + 2);
      __first._M_current = _Var5._M_current + 2;
      if (bVar2) goto LAB_0044c96e;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
              ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                            *)&local_48,_Var5._M_current + 3);
      __first._M_current = _Var5._M_current + 3;
      if (bVar2) goto LAB_0044c96e;
      _Var5._M_current = _Var5._M_current + 4;
      lVar4 = lVar4 + -0x280;
    }
    lVar4 = lVar4 / 0xa0;
    if (lVar4 == 1) {
LAB_0044c950:
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
              ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                            *)&local_48,_Var5);
      __first._M_current = _Var5._M_current;
      if (!bVar2) {
        __first._M_current = pCVar1;
      }
LAB_0044c96e:
      _Var5._M_current = __first._M_current;
      if (__first._M_current != pCVar1) {
        while (_Var5._M_current = _Var5._M_current + 1, _Var5._M_current != pCVar1) {
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
                  ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                                *)&local_58,_Var5);
          if (!bVar2) {
            COutput::operator=(__first._M_current,_Var5._M_current);
            __first._M_current = __first._M_current + 1;
          }
        }
      }
    }
    else {
      if (lVar4 == 2) {
LAB_0044c93a:
        bVar2 = __gnu_cxx::__ops::
                _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
                ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                              *)&local_48,_Var5);
        __first._M_current = _Var5._M_current;
        if (!bVar2) {
          _Var5._M_current = _Var5._M_current + 1;
          goto LAB_0044c950;
        }
        goto LAB_0044c96e;
      }
      __first._M_current = pCVar1;
      if (lVar4 == 3) {
        bVar2 = __gnu_cxx::__ops::
                _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
                ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                              *)&local_48,_Var5);
        __first._M_current = _Var5._M_current;
        if (!bVar2) {
          _Var5._M_current = _Var5._M_current + 1;
          goto LAB_0044c93a;
        }
        goto LAB_0044c96e;
      }
    }
    std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::erase
              ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&p_Var3[1]._M_parent,
               (const_iterator)__first._M_current,(COutput *)p_Var3[1]._M_left);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
  } while( true );
}

Assistant:

void CoinsResult::Erase(const std::unordered_set<COutPoint, SaltedOutpointHasher>& coins_to_remove)
{
    for (auto& [type, vec] : coins) {
        auto remove_it = std::remove_if(vec.begin(), vec.end(), [&](const COutput& coin) {
            // remove it if it's on the set
            if (coins_to_remove.count(coin.outpoint) == 0) return false;

            // update cached amounts
            total_amount -= coin.txout.nValue;
            if (coin.HasEffectiveValue()) total_effective_amount = *total_effective_amount - coin.GetEffectiveValue();
            return true;
        });
        vec.erase(remove_it, vec.end());
    }
}